

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

CloningFilter *
helics::make_cloning_filter
          (InterfaceVisibility locality,FilterTypes type,Federate *mFed,string_view delivery,
          string_view name)

{
  Filter *filt;
  Core *extraout_RDX;
  Core *extraout_RDX_00;
  Core *pCVar1;
  
  if (locality == GLOBAL) {
    filt = &Federate::registerGlobalCloningFilter
                      (mFed,name,(string_view)ZEXT816(0),(string_view)ZEXT816(0))->super_Filter;
    pCVar1 = extraout_RDX;
  }
  else {
    filt = &Federate::registerCloningFilter
                      (mFed,name,(string_view)ZEXT816(0),(string_view)ZEXT816(0))->super_Filter;
    pCVar1 = extraout_RDX_00;
  }
  addOperations(filt,type,pCVar1);
  if (delivery._M_len != 0) {
    CloningFilter::addDeliveryEndpoint((CloningFilter *)filt,delivery);
  }
  return (CloningFilter *)filt;
}

Assistant:

CloningFilter& make_cloning_filter(InterfaceVisibility locality,
                                   FilterTypes type,
                                   Federate* mFed,
                                   std::string_view delivery,
                                   std::string_view name)

{
    auto& dfilt = (locality == InterfaceVisibility::GLOBAL) ?
        mFed->registerGlobalCloningFilter(name) :
        mFed->registerCloningFilter(name);
    addOperations(&dfilt, type, mFed->getCorePointer().get());
    if (!delivery.empty()) {
        dfilt.addDeliveryEndpoint(delivery);
    }
    return dfilt;
}